

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropertyComputer.h
# Opt level: O1

char * cmTargetPropertyComputer::GetLocation<cmGeneratorTarget>
                 (cmGeneratorTarget *tgt,string *prop,cmMessenger *messenger,
                 cmListFileBacktrace *context)

{
  TargetType TVar1;
  ulong __n;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  size_t len;
  string configName;
  string local_50;
  
  TVar1 = tgt->Target->TargetTypeValue;
  if ((TVar1 < OBJECT_LIBRARY) || (TVar1 == UNKNOWN_LIBRARY)) {
    if (GetLocation<cmGeneratorTarget>(cmGeneratorTarget_const*,std::__cxx11::string_const&,cmMessenger*,cmListFileBacktrace_const&)
        ::propLOCATION_abi_cxx11_ == '\0') {
      GetLocation<cmGeneratorTarget>();
    }
    __n = prop->_M_string_length;
    if ((__n == GetLocation<cmGeneratorTarget>(cmGeneratorTarget_const*,std::__cxx11::string_const&,cmMessenger*,cmListFileBacktrace_const&)
                ::propLOCATION_abi_cxx11_._M_string_length) &&
       ((__n == 0 ||
        (iVar4 = bcmp((prop->_M_dataplus)._M_p,
                      GetLocation<cmGeneratorTarget>(cmGeneratorTarget_const*,std::__cxx11::string_const&,cmMessenger*,cmListFileBacktrace_const&)
                      ::propLOCATION_abi_cxx11_._M_dataplus._M_p,__n), iVar4 == 0)))) {
      if ((tgt->Target->IsImportedTarget != false) ||
         (bVar3 = HandleLocationPropertyPolicy(&tgt->Target->Name,messenger,context), bVar3)) {
        pcVar6 = ComputeLocationForBuild<cmGeneratorTarget>(tgt);
        return pcVar6;
      }
    }
    else {
      pcVar6 = (prop->_M_dataplus)._M_p;
      iVar4 = strncmp(pcVar6,"LOCATION_",9);
      if (iVar4 == 0) {
        if ((tgt->Target->IsImportedTarget != false) ||
           (bVar3 = HandleLocationPropertyPolicy(&tgt->Target->Name,messenger,context), bVar3)) {
          pcVar2 = (prop->_M_dataplus)._M_p;
          pcVar6 = pcVar2 + 9;
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          sVar5 = strlen(pcVar6);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,pcVar6,pcVar2 + sVar5 + 9);
          pcVar6 = cmGeneratorTarget::GetLocation(tgt,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p == &local_50.field_2) {
            return pcVar6;
          }
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          return pcVar6;
        }
      }
      else if (8 < __n) {
        iVar4 = strcmp(pcVar6 + (__n - 9),"_LOCATION");
        if ((iVar4 == 0) && (iVar4 = strncmp(pcVar6,"XCODE_ATTRIBUTE_",0x10), iVar4 != 0)) {
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,pcVar6,pcVar6 + (__n - 9));
          iVar4 = std::__cxx11::string::compare((char *)&local_50);
          if (iVar4 != 0) {
            if ((tgt->Target->IsImportedTarget != false) ||
               (bVar3 = HandleLocationPropertyPolicy(&tgt->Target->Name,messenger,context), bVar3))
            {
              tgt = (cmGeneratorTarget *)cmGeneratorTarget::GetLocation(tgt,&local_50);
            }
            else {
              tgt = (cmGeneratorTarget *)0x0;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if (iVar4 != 0) {
            return (char *)tgt;
          }
        }
      }
    }
  }
  return (char *)0x0;
}

Assistant:

static const char* GetLocation(Target const* tgt, std::string const& prop,
                                 cmMessenger* messenger,
                                 cmListFileBacktrace const& context)

  {
    // Watch for special "computed" properties that are dependent on
    // other properties or variables.  Always recompute them.
    if (tgt->GetType() == cmStateEnums::EXECUTABLE ||
        tgt->GetType() == cmStateEnums::STATIC_LIBRARY ||
        tgt->GetType() == cmStateEnums::SHARED_LIBRARY ||
        tgt->GetType() == cmStateEnums::MODULE_LIBRARY ||
        tgt->GetType() == cmStateEnums::UNKNOWN_LIBRARY) {
      static const std::string propLOCATION = "LOCATION";
      if (prop == propLOCATION) {
        if (!tgt->IsImported() &&
            !HandleLocationPropertyPolicy(tgt->GetName(), messenger,
                                          context)) {
          return CM_NULLPTR;
        }
        return ComputeLocationForBuild(tgt);
      }

      // Support "LOCATION_<CONFIG>".
      if (cmHasLiteralPrefix(prop, "LOCATION_")) {
        if (!tgt->IsImported() &&
            !HandleLocationPropertyPolicy(tgt->GetName(), messenger,
                                          context)) {
          return CM_NULLPTR;
        }
        const char* configName = prop.c_str() + 9;
        return ComputeLocation(tgt, configName);
      }

      // Support "<CONFIG>_LOCATION".
      if (cmHasLiteralSuffix(prop, "_LOCATION") &&
          !cmHasLiteralPrefix(prop, "XCODE_ATTRIBUTE_")) {
        std::string configName(prop.c_str(), prop.size() - 9);
        if (configName != "IMPORTED") {
          if (!tgt->IsImported() &&
              !HandleLocationPropertyPolicy(tgt->GetName(), messenger,
                                            context)) {
            return CM_NULLPTR;
          }
          return ComputeLocation(tgt, configName);
        }
      }
    }
    return CM_NULLPTR;
  }